

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O3

PaError Pa_WriteStream(PaStream *stream,void *buffer,unsigned_long frames)

{
  int iVar1;
  int iVar2;
  PaError PVar3;
  
  if (initializationCount_ == 0) {
    iVar2 = -10000;
  }
  else {
    iVar2 = -0x2704;
    if ((stream != (PaStream *)0x0) && (*stream == 0x18273645)) {
      if (frames == 0) {
        iVar2 = 0;
      }
      else if (buffer == (void *)0x0) {
        iVar2 = -0x26f4;
      }
      else {
        iVar1 = (**(code **)(*(long *)((long)stream + 0x10) + 0x20))(stream);
        if (iVar1 == 0) {
          PVar3 = (**(code **)(*(long *)((long)stream + 0x10) + 0x48))(stream,buffer,frames);
          return PVar3;
        }
        iVar2 = -0x26ff;
        if (iVar1 != 1) {
          iVar2 = iVar1;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

PaError Pa_WriteStream( PaStream* stream,
                        const void *buffer,
                        unsigned long frames )
{
    PaError result = PaUtil_ValidateStreamPointer( stream );

    PA_LOGAPI_ENTER_PARAMS( "Pa_WriteStream" );
    PA_LOGAPI(("\tPaStream* stream: 0x%p\n", stream ));

    if( result == paNoError )
    {
        if( frames == 0 )
        {
            /* @todo Should we not allow the implementation to signal any underflow condition? see: http://www.portaudio.com/trac/ticket/116*/
            result = paNoError;
        }
        else if( buffer == 0 )
        {
            result = paBadBufferPtr;
        }
        else
        {
            result = PA_STREAM_INTERFACE(stream)->IsStopped( stream );
            if( result == 0 )
            {
                result = PA_STREAM_INTERFACE(stream)->Write( stream, buffer, frames );
            }
            else if( result == 1 )
            {
                result = paStreamIsStopped;
            }
        }
    }

    PA_LOGAPI_EXIT_PAERROR( "Pa_WriteStream", result );

    return result;
}